

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O3

void __thiscall
gl3cts::GPUShader5ImplicitConversionsTest::executeTestCase
          (GPUShader5ImplicitConversionsTest *this,testCase *test_case)

{
  _Alloc_hider _Var1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLchar **__dest;
  char *this_00;
  string fs_body;
  programInfo program;
  size_type __dnew;
  GLchar **local_88;
  GLchar *local_80;
  GLchar *local_78 [2];
  programInfo local_68;
  string local_50;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_88 = local_78;
  local_50._M_dataplus._M_p = (GLchar *)0x55;
  __dest = (GLchar **)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_50);
  _Var1._M_p = local_50._M_dataplus._M_p;
  local_78[0] = local_50._M_dataplus._M_p;
  this_00 = 
  "#version 130\n\nin  vec4 result;\nout vec4 color;\n\nvoid main()\n{\n    color = result;\n}\n\n";
  local_88 = __dest;
  memcpy(__dest,
         "#version 130\n\nin  vec4 result;\nout vec4 color;\n\nvoid main()\n{\n    color = result;\n}\n\n"
         ,0x55);
  local_80 = _Var1._M_p;
  *(GLchar *)((long)__dest + (long)_Var1._M_p) = '\0';
  getVertexShader_abi_cxx11_
            (&local_50,(GPUShader5ImplicitConversionsTest *)this_00,test_case->m_destination_type,
             test_case->m_source_type);
  local_68.m_context = (this->super_TestCase).m_context;
  local_68.m_fragment_shader_id = 0;
  local_68.m_program_object_id = 0;
  local_68.m_vertex_shader_id = 0;
  Utils::programInfo::build(&local_68,(GLchar *)local_88,local_50._M_dataplus._M_p);
  (**(code **)(lVar4 + 0x1680))(local_68.m_program_object_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x228);
  Utils::programInfo::setUniform
            (&local_68,test_case->m_source_variable_type,"u1",test_case->m_u1_data);
  Utils::programInfo::setUniform
            (&local_68,test_case->m_source_variable_type,"u2",test_case->m_u2_data);
  (**(code **)(lVar4 + 0x1c0))(0x3f000000,0x3f000000,0x3f000000,0x3f000000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"clearColor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x22f);
  (**(code **)(lVar4 + 0x188))(0x4000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x232);
  (**(code **)(lVar4 + 0x538))(5,0,4);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0x236);
  Utils::programInfo::~programInfo(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,(ulong)(local_78[0] + 1));
  }
  verifyImage(this,0xffffffff,test_case->m_is_white_expected);
  return;
}

Assistant:

void GPUShader5ImplicitConversionsTest::executeTestCase(const testCase& test_case)
{
	static const glw::GLuint white_color = 0xffffffff;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Run test case */
	{
		/* Get shaders */
		const std::string& fs = getFragmentShader();
		const std::string& vs = getVertexShader(test_case.m_destination_type, test_case.m_source_type);

		/* Prepare program */
		Utils::programInfo program(m_context);

		program.build(fs.c_str(), vs.c_str());

		gl.useProgram(program.m_program_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

		program.setUniform(test_case.m_source_variable_type, "u1", test_case.m_u1_data);
		program.setUniform(test_case.m_source_variable_type, "u2", test_case.m_u2_data);

		/* Clear FBO */
		gl.clearColor(0.5f, 0.5f, 0.5f, 0.5f);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clearColor");

		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

		/* Draw a triangle strip */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");
	}

	/* Verification */
	verifyImage(white_color, test_case.m_is_white_expected);
}